

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O0

int nuraft::nuraft_global_mgr::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool created;
  nuraft_global_mgr *mgr;
  nuraft_global_mgr *in_stack_000000e0;
  nuraft_global_mgr *local_10;
  
  ngm_singleton::get_instance();
  local_10 = ngm_singleton::get((ngm_singleton *)0x208316);
  if (local_10 == (nuraft_global_mgr *)0x0) {
    ngm_singleton::get_instance();
    bVar1 = ngm_singleton::create((ngm_singleton *)mgr);
    ngm_singleton::get_instance();
    local_10 = ngm_singleton::get((ngm_singleton *)0x208343);
    if (bVar1) {
      (local_10->config_).num_commit_threads_ = *(size_t *)ctx;
      (local_10->config_).num_append_threads_ = *(size_t *)(ctx + 8);
      (local_10->config_).max_scheduling_unit_ms_ = *(size_t *)(ctx + 0x10);
      init_thread_pool(in_stack_000000e0);
    }
  }
  return (int)local_10;
}

Assistant:

nuraft_global_mgr* nuraft_global_mgr::init(const nuraft_global_config& config) {
    nuraft_global_mgr* mgr = ngm_singleton::get_instance().get();
    if (!mgr) {
        bool created = ngm_singleton::get_instance().create();
        mgr = ngm_singleton::get_instance().get();
        if (created) {
            mgr->config_ = config;
            mgr->init_thread_pool();
        }
    }
    return mgr;
}